

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

DispatchCallResult __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *actualInterfaceName,uint64_t requestedTypeId)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  unsigned_long *in_R9;
  DispatchCallResult DVar4;
  String local_1d8;
  char *local_1b8;
  uint64_t local_1b0;
  Exception local_1a8;
  
  local_1b0 = requestedTypeId;
  kj::_::Debug::makeDescription<char_const(&)[37],char_const*&,unsigned_long&>
            (&local_1d8,
             (Debug *)
             "\"Requested interface not implemented.\", actualInterfaceName, requestedTypeId",
             "Requested interface not implemented.",(char (*) [37])&local_1b0,&local_1b8,in_R9);
  kj::Exception::Exception
            (&local_1a8,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
             ,0x5c,&local_1d8);
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)this,&local_1a8);
  *(undefined2 *)&(this->thisHook).ptr = 0x100;
  kj::Exception::~Exception(&local_1a8);
  sVar2 = local_1d8.content.size_;
  pcVar1 = local_1d8.content.ptr;
  uVar3 = extraout_RDX;
  if (local_1d8.content.ptr != (char *)0x0) {
    local_1d8.content.ptr = (char *)0x0;
    local_1d8.content.size_ = 0;
    (*(code *)**(undefined8 **)local_1d8.content.disposer)
              (local_1d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    uVar3 = extraout_RDX_00;
  }
  DVar4.isStreaming = (bool)(char)uVar3;
  DVar4.allowCancellation = (bool)(char)((ulong)uVar3 >> 8);
  DVar4._10_6_ = (int6)((ulong)uVar3 >> 0x10);
  DVar4.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar4;
}

Assistant:

Capability::Server::DispatchCallResult Capability::Server::internalUnimplemented(
    const char* actualInterfaceName, uint64_t requestedTypeId) {
  return {
    KJ_EXCEPTION(UNIMPLEMENTED, "Requested interface not implemented.",
                 actualInterfaceName, requestedTypeId),
    false, true
  };
}